

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_9(QPDF *pdf,char *arg2)

{
  char *pcVar1;
  ostream *poVar2;
  allocator<char> local_b9;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0 [3];
  QPDFObjectHandle local_98;
  QPDFObjectHandle rstream;
  shared_ptr<Buffer> buf;
  QPDFObjectHandle root;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  QPDFObjectHandle qstream;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_38;
  undefined1 local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  QPDF::getRoot();
  _w = 0x14;
  std::make_shared<Buffer,unsigned_int>((uint *)&buf);
  pcVar1 = (char *)Buffer::getBuffer();
  builtin_strncpy(pcVar1,"data for new stream\n",0x14);
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&buf.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  QPDFObjectHandle::newStream(&qstream,pdf,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  QPDFObjectHandle::newStream((QPDF *)&rstream);
  QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  poVar2 = std::operator<<((ostream *)&std::cout,"oops -- getStreamData didn\'t throw");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"data for other stream\n",&local_b9);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData((string *)&rstream,(QPDFObjectHandle *)&w,&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"/QStream",(allocator<char> *)&local_98);
  QPDFObjectHandle::replaceKey((string *)&root,(QPDFObjectHandle *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"/RStream",(allocator<char> *)&local_98);
  QPDFObjectHandle::replaceKey((string *)&root,(QPDFObjectHandle *)&w);
  std::__cxx11::string::~string((string *)&w);
  QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(&w,0));
  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&w);
  QPDFWriter::write();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rstream.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&qstream.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&buf.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

static void
test_9(QPDF& pdf, char const* arg2)
{
    QPDFObjectHandle root = pdf.getRoot();
    // Explicitly exercise the Buffer version of newStream
    auto buf = std::make_shared<Buffer>(20U);
    unsigned char* bp = buf->getBuffer();
    memcpy(bp, "data for new stream\n", 20); // no null!
    QPDFObjectHandle qstream = QPDFObjectHandle::newStream(&pdf, buf);
    QPDFObjectHandle rstream = QPDFObjectHandle::newStream(&pdf);
    try {
        rstream.getStreamData();
        std::cout << "oops -- getStreamData didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "exception: " << e.what() << std::endl;
    }
    rstream.replaceStreamData(
        "data for other stream\n", QPDFObjectHandle::newNull(), QPDFObjectHandle::newNull());
    root.replaceKey("/QStream", qstream);
    root.replaceKey("/RStream", rstream);
    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}